

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O2

string_view trim(string_view s)

{
  size_type sVar1;
  size_t sVar2;
  ulong uVar3;
  string_view sVar4;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_str = s._M_str;
  local_30._M_len = s._M_len;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                    (&local_30," \t\r\v\n",0);
  if (local_30._M_len < sVar1) {
    sVar1 = local_30._M_len;
  }
  local_30._M_str = local_30._M_str + sVar1;
  uVar3 = local_30._M_len - sVar1;
  local_30._M_len = uVar3;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                    (&local_30," \t\r\v\n",0xffffffffffffffff);
  uVar3 = ~sVar1 + uVar3;
  sVar2 = local_30._M_len - uVar3;
  if (local_30._M_len < uVar3) {
    sVar2 = 0;
  }
  sVar4._M_str = local_30._M_str;
  sVar4._M_len = sVar2;
  return sVar4;
}

Assistant:

string_view trim(string_view s)
{
	s.remove_prefix(min(s.find_first_not_of(" \t\r\v\n"), s.size()));
	s.remove_suffix(min(s.size() - s.find_last_not_of(" \t\r\v\n") - 1, s.size()));
	return s;
}